

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::update_beamlets_impact
          (EvaluationFunction *this,int o,int k,double prev_Dok)

{
  _List_node_base *p_Var1;
  mapped_type *pmVar2;
  Matrix *pMVar3;
  long lVar4;
  pair<int,_int> bl;
  iterator __end1;
  key_type local_60;
  long local_58;
  long local_50;
  double local_48;
  _List_node_base *local_40;
  double local_38;
  
  local_60.second = k;
  local_60.first = o;
  local_48 = prev_Dok;
  p_Var1 = (_List_node_base *)
           std::__detail::
           _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::__cxx11::list<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->voxel2beamlet_list,&local_60);
  local_58 = (long)o * 0x18;
  local_50 = (long)o << 6;
  local_40 = p_Var1;
  while (p_Var1 = (((_List_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != local_40) {
    local_60 = (key_type)p_Var1[1]._M_next;
    pmVar2 = std::__detail::
             _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->beamlet_impact,&local_60);
    *pmVar2 = *pmVar2 - local_48;
    lVar4 = (long)local_60.second;
    pMVar3 = Volume::getDepositionMatrix
                       ((Volume *)
                        ((long)&((this->volumes->
                                 super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>).
                                 _M_impl.super__Vector_impl_data._M_start)->collimator + local_50),
                        local_60.first);
    local_38 = *(double *)
                (*(long *)((long)&(((this->D).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data + local_58) + (long)k * 8) *
               pMVar3->p[k][lVar4];
    pmVar2 = std::__detail::
             _Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_double>,_std::allocator<std::pair<const_std::pair<int,_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->beamlet_impact,&local_60);
    *pmVar2 = local_38 + *pmVar2;
  }
  return;
}

Assistant:

void EvaluationFunction::update_beamlets_impact(int o, int k, double prev_Dok){
	list<pair <int,int> >& beamlets = voxel2beamlet_list[make_pair(o,k)];
	for(auto bl:beamlets){
		beamlet_impact[bl] -= prev_Dok;
		int angle = bl.first;
		int b = bl.second;
		const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		beamlet_impact[bl] += D[o][k] * Dep(k,b);
	}


}